

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O2

MPP_RET vdpp_init(VdppCtx *ictx)

{
  int *piVar1;
  int iVar2;
  char *fmt;
  MPP_RET MVar3;
  RK_U32 client_data;
  MppReqV1 mpp_req;
  
  client_data = 0x1d;
  piVar1 = (int *)*ictx;
  if (piVar1 == (int *)0x0) {
    _mpp_log_l(2,"vdpp","found NULL input vdpp ctx %p\n","vdpp_init",0);
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    mpp_env_get_u32("vdpp_debug",&vdpp_debug,0);
    iVar2 = open("/dev/mpp_service",0x80002);
    *piVar1 = iVar2;
    if (iVar2 < 0) {
      fmt = "can NOT find device /dev/vdpp\n";
    }
    else {
      mpp_req.cmd = 0x100;
      mpp_req.flag = 0;
      mpp_req.size = 4;
      mpp_req.data_ptr = (RK_U64)&client_data;
      memset(piVar1 + 2,0,0x100);
      piVar1[5] = 0x780;
      piVar1[6] = 0x438;
      piVar1[7] = 0x780;
      piVar1[8] = 0x438;
      *(undefined1 *)(piVar1 + 0xf) = 1;
      piVar1[0x10] = 10;
      piVar1[0x11] = 4;
      piVar1[0x12] = 6;
      piVar1[0x13] = 0xc;
      piVar1[0x14] = 0xc;
      piVar1[0x15] = 8;
      piVar1[0x16] = 0x10;
      piVar1[0x17] = 5;
      piVar1[0x18] = 0x14;
      piVar1[0x19] = 0x690;
      piVar1[0x1a] = 0x1a40;
      piVar1[0x1c] = 0xffff;
      piVar1[0x1d] = 2;
      piVar1[0x1e] = 5;
      piVar1[0x1f] = 0x10;
      piVar1[0x20] = 0xc;
      piVar1[0x21] = 8;
      piVar1[0x22] = 0x1e;
      piVar1[0x23] = 10;
      piVar1[0x28] = 0;
      piVar1[0x24] = 0;
      piVar1[0x25] = 0;
      piVar1[0x26] = 0;
      piVar1[0x27] = 0;
      piVar1[0x29] = 0x3c;
      piVar1[0x2a] = 0x28;
      piVar1[0x2b] = 0x14;
      piVar1[0x2c] = 10;
      piVar1[0x2d] = 10;
      piVar1[0x2e] = 10;
      piVar1[0x2f] = 10;
      vdpp_set_default_zme_param((zme_params *)(piVar1 + 0x30));
      iVar2 = ioctl(*piVar1,0x40047601,&mpp_req);
      if (iVar2 == 0) {
        return MPP_OK;
      }
      fmt = "ioctl set_client failed\n";
    }
    _mpp_log_l(2,"vdpp",fmt,(char *)0x0);
    MVar3 = MPP_NOK;
  }
  return MVar3;
}

Assistant:

MPP_RET vdpp_init(VdppCtx *ictx)
{
    MPP_RET ret;
    MppReqV1 mpp_req;
    RK_U32 client_data = VDPP_CLIENT_TYPE;
    struct vdpp_api_ctx *ctx = NULL;

    if (NULL == *ictx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", *ictx);
        return MPP_ERR_NULL_PTR;
    }

    ctx = *ictx;

    mpp_env_get_u32("vdpp_debug", &vdpp_debug, 0);

    ctx->fd = open("/dev/mpp_service", O_RDWR | O_CLOEXEC);
    if (ctx->fd < 0) {
        mpp_err("can NOT find device /dev/vdpp\n");
        return MPP_NOK;
    }

    mpp_req.cmd = MPP_CMD_INIT_CLIENT_TYPE;
    mpp_req.flag = 0;
    mpp_req.size = sizeof(client_data);
    mpp_req.data_ptr = REQ_DATA_PTR(&client_data);

    memset(&ctx->params, 0, sizeof(struct vdpp_params));
    /* set default parameters */
    vdpp_set_default_param(&ctx->params);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err("ioctl set_client failed\n");
        return MPP_NOK;
    }

    return MPP_OK;
}